

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title.c
# Opt level: O3

void set_title(char *title)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 *puVar3;
  int extraout_EDX;
  long *plVar4;
  int64_t eval_b;
  int64_t eval_a;
  char buffer [512];
  long lStack_a58;
  char acStack_a50 [256];
  code *pcStack_950;
  undefined8 uStack_940;
  code *pcStack_938;
  long lStack_930;
  long lStack_928;
  long lStack_920;
  undefined8 auStack_918 [13];
  undefined1 *puStack_8b0;
  char *pcStack_8a8;
  long *plStack_8a0;
  long *plStack_898;
  undefined8 uStack_890;
  code *pcStack_880;
  undefined1 *puStack_878;
  undefined1 **ppuStack_870;
  undefined8 uStack_868;
  undefined8 uStack_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 uStack_840;
  undefined8 uStack_838;
  long alStack_830 [63];
  undefined1 uStack_631;
  undefined1 auStack_630 [1024];
  char *pcStack_230;
  char local_208 [512];
  
  iVar1 = uv_get_process_title(local_208,0x200);
  if (iVar1 == 0) {
    iVar1 = uv_set_process_title(title);
    if (iVar1 != 0) goto LAB_001b72c5;
    iVar1 = uv_get_process_title(local_208,0x200);
    if (iVar1 != 0) goto LAB_001b72d2;
    iVar1 = strcmp(local_208,title);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    set_title_cold_1();
LAB_001b72c5:
    set_title_cold_2();
LAB_001b72d2:
    set_title_cold_3();
  }
  set_title_cold_4();
  plVar4 = &lStack_930;
  lStack_920 = 0x3ff;
  puVar3 = auStack_630;
  pcStack_938 = (code *)0x1b7314;
  pcStack_230 = title;
  iVar1 = uv_exepath(puVar3);
  alStack_830[0] = (long)iVar1;
  auStack_918[0] = 0;
  if (alStack_830[0] == 0) {
    auStack_630[lStack_920] = 0;
    pcStack_938 = (code *)0x1b7364;
    memset(alStack_830,0x78,0x1ff);
    uStack_631 = 0;
    ppuStack_870 = &puStack_8b0;
    pcStack_8a8 = "process_title_big_argv_helper";
    uStack_890 = 0;
    uStack_868 = 0;
    uStack_860 = 0;
    uStack_858 = 0;
    uStack_850 = 0;
    uStack_848 = 0;
    uStack_840 = 0;
    uStack_838 = 0;
    pcStack_880 = exit_cb;
    pcStack_938 = (code *)0x1b73c2;
    puStack_8b0 = puVar3;
    plStack_8a0 = alStack_830;
    plStack_898 = alStack_830;
    puStack_878 = puVar3;
    uVar2 = uv_default_loop();
    pcStack_938 = (code *)0x1b73d2;
    iVar1 = uv_spawn(uVar2,auStack_918,&pcStack_880);
    lStack_928 = (long)iVar1;
    lStack_930 = 0;
    if (lStack_928 != 0) goto LAB_001b7485;
    pcStack_938 = (code *)0x1b73f1;
    uVar2 = uv_default_loop();
    pcStack_938 = (code *)0x1b73fb;
    iVar1 = uv_run(uVar2,0);
    lStack_928 = (long)iVar1;
    lStack_930 = 0;
    if (lStack_928 == 0) {
      pcStack_938 = (code *)0x1b741a;
      puVar3 = (undefined1 *)uv_default_loop();
      pcStack_938 = (code *)0x1b742e;
      uv_walk(puVar3,close_walk_cb,0);
      pcStack_938 = (code *)0x1b7438;
      uv_run(puVar3,0);
      lStack_928 = 0;
      pcStack_938 = (code *)0x1b7446;
      uVar2 = uv_default_loop();
      pcStack_938 = (code *)0x1b744e;
      iVar1 = uv_loop_close(uVar2);
      lStack_930 = (long)iVar1;
      if (lStack_928 == lStack_930) {
        pcStack_938 = (code *)0x1b7464;
        uv_library_shutdown();
        return;
      }
      goto LAB_001b749f;
    }
  }
  else {
    pcStack_938 = (code *)0x1b7485;
    run_test_process_title_big_argv_cold_1();
LAB_001b7485:
    pcStack_938 = (code *)0x1b7492;
    run_test_process_title_big_argv_cold_2();
  }
  pcStack_938 = (code *)0x1b749f;
  run_test_process_title_big_argv_cold_3();
LAB_001b749f:
  pcStack_938 = exit_cb;
  run_test_process_title_big_argv_cold_4();
  uStack_940 = 0;
  if (plVar4 == (long *)0x0) {
    pcStack_938 = (code *)(long)extraout_EDX;
    uStack_940 = 0;
    if (pcStack_938 == (code *)0x0) {
      uv_close();
      return;
    }
  }
  else {
    pcStack_950 = (code *)0x1b7501;
    pcStack_938 = (code *)plVar4;
    exit_cb_cold_1();
  }
  pcStack_950 = process_title_big_argv;
  exit_cb_cold_2();
  pcStack_950 = (code *)puVar3;
  memset(acStack_a50,0,0x100);
  builtin_strncpy(acStack_a50,"fail",4);
  uv_get_process_title(acStack_a50,0x100);
  lStack_a58 = 0;
  iVar1 = strcmp(acStack_a50,"fail");
  if (lStack_a58 != iVar1) {
    return;
  }
  plVar4 = &lStack_a58;
  process_title_big_argv_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(plVar4,0);
  return;
}

Assistant:

static void set_title(const char* title) {
  char buffer[512];
  int err;

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT_OK(err);

  err = uv_set_process_title(title);
  ASSERT_OK(err);

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT_OK(err);

  ASSERT_OK(strcmp(buffer, title));
}